

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::leaveInteractiveMode(QMdiSubWindowPrivate *this)

{
  bool bVar1;
  QMdiSubWindowPrivate *this_00;
  QWidget *pQVar2;
  QMdiSubWindowPrivate *in_RDI;
  QMdiSubWindowPrivate *unaff_retaddr;
  QMdiSubWindow *q;
  
  this_00 = (QMdiSubWindowPrivate *)q_func(in_RDI);
  if ((in_RDI->isInRubberBandMode & 1U) == 0) {
    QWidget::releaseMouse((QWidget *)0x62df05);
  }
  else {
    leaveRubberBandMode(unaff_retaddr);
  }
  in_RDI->isInInteractiveMode = false;
  in_RDI->currentOperation = None;
  updateDirtyRegions(this_00);
  updateCursor(unaff_retaddr);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x62df38);
  if (bVar1) {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62df4e);
    pQVar2 = QWidget::focusWidget((QWidget *)0x62df56);
    if (pQVar2 != (QWidget *)0x0) {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62df6c);
      QWidget::focusWidget((QWidget *)0x62df74);
      QWidget::setFocus((QWidget *)0x62df7c);
    }
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::leaveInteractiveMode()
{
    Q_Q(QMdiSubWindow);
#if QT_CONFIG(rubberband)
    if (isInRubberBandMode)
        leaveRubberBandMode();
    else
#endif
        q->releaseMouse();
    isInInteractiveMode = false;
    currentOperation = None;
    updateDirtyRegions();
    updateCursor();
    if (baseWidget && baseWidget->focusWidget())
        baseWidget->focusWidget()->setFocus();
}